

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O1

void __thiscall
Address_ElementsInvalidAddressTest_Test::~Address_ElementsInvalidAddressTest_Test
          (Address_ElementsInvalidAddressTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Address, ElementsInvalidAddressTest) {
  // invalid address prefix [base58(01 + pubkey hash)]
  EXPECT_THROW(Address("C76uVp7JJqeUKht3wQXajaaGvUJAfEDnPx", GetElementsAddressFormatList()),
      CfdException)<< "pref";
  // invalid data (decode error)
  EXPECT_THROW(Address("DbJDuZXuDVSiYB6QXb5fn", GetElementsAddressFormatList()), CfdException)<< "len";

  ByteData160 hash =
      HashUtil::Hash160(
          Pubkey(
              "02d21c625759280111907a06df050cccbc875b11a50bdafa71dae5d1e8695ba82e"));
  // invalid net type
  EXPECT_THROW(Address(ElementsNetType::kNetTypeNum, ElementsAddressType::kP2pkhAddress, hash, GetElementsAddressFormatList()), CfdException)<< "net";
}